

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities_strtod.cpp
# Opt level: O0

void __thiscall Js::BIGNUM::MakeLowerBound(BIGNUM *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  uint32 luT;
  BIGNUM *this_local;
  
  if (this->m_luError == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities_strtod.cpp"
                                ,0x81,"(m_luError < 0xFFFFFFFF)","m_luError < 0xFFFFFFFF");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = this->m_luError + 1 >> 1;
  if ((((uVar3 != 0) && (iVar4 = NumberUtilities::AddLu(&this->m_lu0,-uVar3), iVar4 == 0)) &&
      (iVar4 = NumberUtilities::AddLu(&this->m_lu1,0xffffffff), iVar4 == 0)) &&
     (NumberUtilities::AddLu(&this->m_lu2,0xffffffff), (this->m_lu2 & 0x80000000) == 0)) {
    Normalize(this);
  }
  this->m_luError = 0;
  return;
}

Assistant:

void MakeLowerBound(void)
    {
        Assert(m_luError < 0xFFFFFFFF);
        uint32 luT = (m_luError + 1) >> 1;

        if (luT &&
            !Js::NumberUtilities::AddLu(&m_lu0, (uint32)-(int32)luT) &&
            !Js::NumberUtilities::AddLu(&m_lu1, 0xFFFFFFFF))
        {
            Js::NumberUtilities::AddLu(&m_lu2, 0xFFFFFFFF);
            if (0 == (0x80000000 & m_lu2))
                Normalize();
        }
        m_luError = 0;
    }